

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

IString __thiscall wasm::Wasm2JSBuilder::fromName(Wasm2JSBuilder *this,Name name,NameScope scope)

{
  iterator iVar1;
  ostream *poVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  undefined4 in_register_0000000c;
  char *pcVar5;
  int iVar6;
  Name name_00;
  char *local_250;
  ostringstream out;
  string local_d8;
  string local_b8;
  undefined1 local_98 [8];
  string mangled;
  string_view local_48;
  NameScope local_34;
  
  pcVar5 = (char *)CONCAT44(in_register_0000000c,scope);
  name_00.super_IString.str._M_len = name.super_IString.str._M_str;
  local_250 = name_00.super_IString.str._M_len;
  iVar1 = std::
          _Hashtable<const_void_*,_std::pair<const_void_*const,_wasm::IString>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this->wasmNameToMangledName[(int)scope]._M_h,&local_250);
  if (iVar1.super__Node_iterator_base<std::pair<const_void_*const,_wasm::IString>,_false>._M_cur !=
      (__node_type *)0x0) {
    return (IString)*(string_view *)
                     ((long)iVar1.
                            super__Node_iterator_base<std::pair<const_void_*const,_wasm::IString>,_false>
                            ._M_cur + 0x10);
  }
  local_48 = (string_view)ZEXT816(0);
  iVar6 = 0;
  local_34 = scope;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_250);
    name_00.super_IString.str._M_str = pcVar5;
    wasm::operator<<((wasm *)&local_250,name.super_IString.str._M_len,name_00);
    if (iVar6 != 0) {
      poVar2 = std::operator<<((ostream *)&local_250,"_");
      std::ostream::operator<<(poVar2,iVar6);
    }
    std::__cxx11::stringbuf::str();
    asmangle((string *)local_98,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::string((string *)&local_b8,(string *)local_98);
    local_48 = (string_view)stringToIString(&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    sVar3 = std::
            _Hashtable<wasm::IString,_wasm::IString,_std::allocator<wasm::IString>,_std::__detail::_Identity,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&this->mangledNames[(int)scope]._M_h,(key_type *)&local_48);
    if (sVar3 == 0) {
      if ((local_34 != Local) ||
         (sVar3 = std::
                  _Hashtable<wasm::IString,_wasm::IString,_std::allocator<wasm::IString>,_std::__detail::_Identity,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::count(&this->mangledNames[1]._M_h,(key_type *)&local_48), sVar3 == 0)) {
        std::__detail::
        _Insert_base<wasm::IString,_wasm::IString,_std::allocator<wasm::IString>,_std::__detail::_Identity,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<wasm::IString,_wasm::IString,_std::allocator<wasm::IString>,_std::__detail::_Identity,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)&this->mangledNames[(int)scope]._M_h,(value_type *)&local_48);
        mangled.field_2._8_8_ = name_00.super_IString.str._M_len;
        pmVar4 = std::__detail::
                 _Map_base<const_void_*,_std::pair<const_void_*const,_wasm::IString>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<const_void_*,_std::pair<const_void_*const,_wasm::IString>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->wasmNameToMangledName[(int)scope]._M_h,
                              (key_type *)((long)&mangled.field_2 + 8));
        (pmVar4->str)._M_len = local_48._M_len;
        (pmVar4->str)._M_str = local_48._M_str;
        std::__cxx11::string::~string((string *)local_98);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_250);
        return (IString)local_48;
      }
    }
    else if (local_34 == Export) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"wasm2js: warning: export names colliding: ");
      poVar2 = std::operator<<(poVar2,(string *)local_98);
      std::operator<<(poVar2,'\n');
    }
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_250);
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

IString fromName(Name name, NameScope scope) {
    // TODO: checking names do not collide after mangling

    // First up check our cached of mangled names to avoid doing extra work
    // below
    auto& map = wasmNameToMangledName[(int)scope];
    auto it = map.find(name.str.data());
    if (it != map.end()) {
      return it->second;
    }
    // The mangled names in our scope.
    auto& scopeMangledNames = mangledNames[(int)scope];
    // In some cases (see below) we need to also check the Top scope.
    auto& topMangledNames = mangledNames[int(NameScope::Top)];

    // This is the first time we've seen the `name` and `scope` pair. Generate a
    // globally unique name based on `name` and then register that in our cache
    // and return it.
    //
    // Identifiers here generated are of the form `${name}_${n}` where `_${n}`
    // is omitted if `n==0` and otherwise `n` is just looped over to find the
    // next unused identifier.
    IString ret;
    for (int i = 0;; i++) {
      std::ostringstream out;
      out << name;
      if (i > 0) {
        out << "_" << i;
      }
      auto mangled = asmangle(out.str());
      ret = stringToIString(mangled);
      if (scopeMangledNames.count(ret)) {
        // When export names collide things may be confusing, as this is
        // observable externally by the person using the JS. Report a warning.
        if (scope == NameScope::Export) {
          std::cerr << "wasm2js: warning: export names colliding: " << mangled
                    << '\n';
        }
        continue;
      }
      // The Local scope is special: a Local name must not collide with a Top
      // name, as they are in a single namespace in JS and can conflict:
      //
      // function foo(bar) {
      //   var bar = 0;
      // }
      // function bar() { ..
      if (scope == NameScope::Local && topMangledNames.count(ret)) {
        continue;
      }
      // We found a good name, use it.
      scopeMangledNames.insert(ret);
      map[name.str.data()] = ret;
      return ret;
    }
  }